

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O1

string * Assimp::FBX::Util::AddTokenText
                   (string *__return_storage_ptr__,string *prefix,string *text,Token *tok)

{
  ostream *poVar1;
  char *local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (tok->column == 0xffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," (",2);
    if ((ulong)tok->type < 6) {
      local_1a8 = (&PTR_anon_var_dwarf_13299f6_008e45c0)[tok->type];
    }
    else {
      local_1a8 = "";
    }
    poVar1 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1a0,&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset 0x",0xb);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," (",2);
    if ((ulong)tok->type < 6) {
      local_1a8 = (&PTR_anon_var_dwarf_13299f6_008e45c0)[tok->type];
    }
    else {
      local_1a8 = "";
    }
    poVar1 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1a0,&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", line ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", col ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string AddTokenText(const std::string& prefix, const std::string& text, const Token* tok)
{
    if(tok->IsBinary()) {
        return static_cast<std::string>( (Formatter::format() << prefix <<
            " (" << TokenTypeString(tok->Type()) <<
            ", offset 0x" << std::hex << tok->Offset() << ") " <<
            text) );
    }

    return static_cast<std::string>( (Formatter::format() << prefix <<
        " (" << TokenTypeString(tok->Type()) <<
        ", line " << tok->Line() <<
        ", col " << tok->Column() << ") " <<
        text) );
}